

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_validateSequence
                 (U32 offCode,U32 matchLength,U32 minMatch,size_t posInSrc,U32 windowLog,
                 size_t dictSize,int useSequenceProducer)

{
  uint uVar1;
  ulong in_RCX;
  int in_EDX;
  uint in_ESI;
  uint in_EDI;
  byte in_R8B;
  long in_R9;
  int in_stack_00000008;
  size_t matchLenLowerBound;
  size_t offsetBound;
  U32 windowSize;
  ulong local_50;
  size_t local_8;
  
  uVar1 = 1 << (in_R8B & 0x1f);
  if (uVar1 < in_RCX) {
    local_50 = (ulong)uVar1;
  }
  else {
    local_50 = in_RCX + in_R9;
  }
  uVar1 = 4;
  if (in_EDX == 3 || in_stack_00000008 != 0) {
    uVar1 = 3;
  }
  if (local_50 != 0) {
    if (local_50 + 3 < (ulong)in_EDI) {
      local_8 = 0xffffffffffffff95;
    }
    else if (in_ESI < uVar1) {
      local_8 = 0xffffffffffffff95;
    }
    else {
      local_8 = 0;
    }
    return local_8;
  }
  __assert_fail("(offsetBound)>0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x699a,"size_t ZSTD_validateSequence(U32, U32, U32, size_t, U32, size_t, int)");
}

Assistant:

static size_t
ZSTD_validateSequence(U32 offCode, U32 matchLength, U32 minMatch,
                      size_t posInSrc, U32 windowLog, size_t dictSize, int useSequenceProducer)
{
    U32 const windowSize = 1u << windowLog;
    /* posInSrc represents the amount of data the decoder would decode up to this point.
     * As long as the amount of data decoded is less than or equal to window size, offsets may be
     * larger than the total length of output decoded in order to reference the dict, even larger than
     * window size. After output surpasses windowSize, we're limited to windowSize offsets again.
     */
    size_t const offsetBound = posInSrc > windowSize ? (size_t)windowSize : posInSrc + (size_t)dictSize;
    size_t const matchLenLowerBound = (minMatch == 3 || useSequenceProducer) ? 3 : 4;
    RETURN_ERROR_IF(offCode > OFFSET_TO_OFFBASE(offsetBound), externalSequences_invalid, "Offset too large!");
    /* Validate maxNbSeq is large enough for the given matchLength and minMatch */
    RETURN_ERROR_IF(matchLength < matchLenLowerBound, externalSequences_invalid, "Matchlength too small for the minMatch");
    return 0;
}